

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

_Bool tree_sitter_gdscript_external_scanner_scan(void *payload,TSLexer *lexer,_Bool *valid_symbols)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  bool bVar5;
  _Bool _Var6;
  _Bool _Var7;
  int32_t iVar8;
  int32_t iVar9;
  void *pvVar10;
  bool bVar11;
  int local_90;
  uint local_8c;
  int local_80;
  uint local_7c;
  byte local_62;
  byte local_61;
  void *tmp_1;
  _Bool has_flags;
  void *pvStack_50;
  Delimiter delimiter_1;
  void *tmp;
  uint uStack_40;
  uint16_t current_indent_length;
  int32_t first_comment_indent_length;
  uint32_t indent_length;
  Delimiter local_33;
  _Bool found_end_of_line;
  _Bool has_content;
  int32_t end_char;
  Delimiter delimiter;
  _Bool within_brackets;
  _Bool error_recovery_mode;
  Scanner *scanner;
  _Bool *valid_symbols_local;
  TSLexer *lexer_local;
  void *payload_local;
  
  local_61 = 0;
  if ((valid_symbols[4] & 1U) != 0) {
    local_61 = valid_symbols[1];
  }
  has_content = (_Bool)(local_61 & 1);
  local_62 = 1;
  if (((valid_symbols[9] & 1U) == 0) && (local_62 = 1, (valid_symbols[7] & 1U) == 0)) {
    local_62 = valid_symbols[8];
  }
  found_end_of_line = (_Bool)(local_62 & 1);
  _end_char = (long *)payload;
  if ((((valid_symbols[4] & 1U) != 0) && (**(int **)((long)payload + 8) != 0)) &&
     (has_content == false)) {
    local_33.flags =
         *(char *)(*(long *)(*(long *)((long)payload + 8) + 8) +
                  (ulong)(**(int **)((long)payload + 8) - 1));
    iVar8 = end_character(&local_33);
    _Var7 = false;
    while (lexer->lookahead != 0) {
      if (((lexer->lookahead == 0x7b) || (lexer->lookahead == 0x7d)) &&
         (_Var6 = is_format(&local_33), _Var6)) {
        (*lexer->mark_end)(lexer);
        lexer->result_symbol = 4;
        return _Var7;
      }
      if (lexer->lookahead == 0x5c) {
        _Var6 = is_raw(&local_33);
        if (!_Var6) {
          _Var6 = is_bytes(&local_33);
          if (!_Var6) {
            (*lexer->mark_end)(lexer);
            lexer->result_symbol = 4;
            return _Var7;
          }
          (*lexer->mark_end)(lexer);
          (*lexer->advance)(lexer,false);
          if (((lexer->lookahead != 0x4e) && (lexer->lookahead != 0x75)) &&
             (lexer->lookahead != 0x55)) {
            lexer->result_symbol = 4;
            return _Var7;
          }
          (*lexer->advance)(lexer,false);
          goto LAB_001062e7;
        }
        (*lexer->advance)(lexer,false);
        iVar2 = lexer->lookahead;
        iVar9 = end_character(&local_33);
        if ((iVar2 == iVar9) || (lexer->lookahead == 0x5c)) {
          (*lexer->advance)(lexer,false);
        }
      }
      else {
        if (lexer->lookahead == iVar8) {
          _Var6 = is_triple(&local_33);
          if (!_Var6) {
            if (_Var7 == false) {
              (*lexer->advance)(lexer,false);
              *(int *)_end_char[1] = *(int *)_end_char[1] + -1;
              lexer->result_symbol = 5;
            }
            else {
              lexer->result_symbol = 4;
            }
            (*lexer->mark_end)(lexer);
            return true;
          }
          (*lexer->mark_end)(lexer);
          (*lexer->advance)(lexer,false);
          if (lexer->lookahead == iVar8) {
            (*lexer->advance)(lexer,false);
            if (lexer->lookahead == iVar8) {
              if (_Var7 == false) {
                (*lexer->advance)(lexer,false);
                (*lexer->mark_end)(lexer);
                *(int *)_end_char[1] = *(int *)_end_char[1] + -1;
                lexer->result_symbol = 5;
              }
              else {
                lexer->result_symbol = 4;
              }
              return true;
            }
            (*lexer->mark_end)(lexer);
            lexer->result_symbol = 4;
            return true;
          }
          (*lexer->mark_end)(lexer);
          lexer->result_symbol = 4;
          return true;
        }
        if (((lexer->lookahead == 10) && (_Var7 != false)) && (_Var7 = is_triple(&local_33), !_Var7)
           ) {
          return false;
        }
LAB_001062e7:
        advance(lexer);
        _Var7 = true;
      }
    }
  }
  (*lexer->mark_end)(lexer);
  bVar5 = false;
  uStack_40 = 0;
  tmp._4_4_ = 0xffffffff;
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while (lexer->lookahead == 10) {
              bVar5 = true;
              uStack_40 = 0;
              skip(lexer);
            }
            if (lexer->lookahead != 0x20) break;
            uStack_40 = uStack_40 + 1;
            skip(lexer);
          }
          if ((lexer->lookahead != 0xd) && (lexer->lookahead != 0xc)) break;
          uStack_40 = 0;
          skip(lexer);
        }
        if (lexer->lookahead != 9) break;
        uStack_40 = uStack_40 + 8;
        skip(lexer);
      }
      if (lexer->lookahead != 0x23) break;
      if (tmp._4_4_ == 0xffffffff) {
        tmp._4_4_ = uStack_40;
      }
      while( true ) {
        bVar11 = false;
        if (lexer->lookahead != 0) {
          bVar11 = lexer->lookahead != 10;
        }
        if (!bVar11) break;
        skip(lexer);
      }
      skip(lexer);
      uStack_40 = 0;
    }
    if (lexer->lookahead != 0x5c) break;
    skip(lexer);
    if (lexer->lookahead == 0xd) {
      skip(lexer);
    }
    if ((lexer->lookahead != 10) && (_Var7 = (*lexer->eof)(lexer), !_Var7)) {
      return false;
    }
    skip(lexer);
  }
  _Var7 = (*lexer->eof)(lexer);
  if (_Var7) {
    uStack_40 = 0;
    bVar5 = true;
  }
  if (bVar5) {
    if (*(int *)*_end_char != 0) {
      uVar1 = *(ushort *)(*(long *)(*_end_char + 8) + (ulong)(*(int *)*_end_char - 1) * 2);
      if (((valid_symbols[1] & 1U) != 0) && (uVar1 < uStack_40)) {
        if (*(int *)(*_end_char + 4) == *(int *)*_end_char) {
          if ((uint)(*(int *)*_end_char * 2) < 0x10) {
            local_7c = 0x10;
          }
          else {
            local_7c = *(int *)*_end_char << 1;
          }
          pvStack_50 = realloc(*(void **)(*_end_char + 8),(ulong)local_7c << 1);
          if (pvStack_50 == (void *)0x0) {
            __assert_fail("tmp != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/PrestonKnopp[P]tree-sitter-gdscript/src/scanner.c"
                          ,0x13b,
                          "_Bool tree_sitter_gdscript_external_scanner_scan(void *, TSLexer *, const _Bool *)"
                         );
          }
          *(void **)(*_end_char + 8) = pvStack_50;
          if ((uint)(*(int *)*_end_char * 2) < 0x10) {
            local_80 = 0x10;
          }
          else {
            local_80 = *(int *)*_end_char << 1;
          }
          *(int *)(*_end_char + 4) = local_80;
        }
        lVar4 = *(long *)(*_end_char + 8);
        uVar3 = *(uint *)*_end_char;
        *(uint *)*_end_char = uVar3 + 1;
        *(short *)(lVar4 + (ulong)uVar3 * 2) = (short)uStack_40;
        lexer->result_symbol = 1;
        return true;
      }
      if ((((valid_symbols[2] & 1U) != 0) ||
          ((((*valid_symbols & 1U) == 0 && ((valid_symbols[3] & 1U) == 0)) &&
           ((found_end_of_line & 1U) == 0)))) &&
         ((uStack_40 < uVar1 && ((int)tmp._4_4_ < (int)(uint)uVar1)))) {
        *(int *)*_end_char = *(int *)*_end_char + -1;
        lexer->result_symbol = 2;
        return true;
      }
    }
    if (((*valid_symbols & 1U) != 0) && ((has_content & 1U) == 0)) {
      lexer->result_symbol = 0;
      return true;
    }
  }
  if (((((((valid_symbols[10] & 1U) == 0) && ((valid_symbols[7] & 1U) == 0)) &&
        ((valid_symbols[9] & 1U) == 0)) && ((valid_symbols[8] & 1U) == 0)) &&
      (((has_content & 1U) != 0 || ((valid_symbols[0xb] & 1U) != 0)))) &&
     (((lexer->lookahead == 0x2c || ((lexer->lookahead == 0x29 || (lexer->lookahead == 0x7d)))) ||
      (lexer->lookahead == 0x5d)))) {
    if (((valid_symbols[2] & 1U) != 0) && (*(int *)*_end_char != 0)) {
      *(int *)*_end_char = *(int *)*_end_char + -1;
    }
    lexer->result_symbol = 0xb;
    return true;
  }
  if ((tmp._4_4_ == 0xffffffff) && ((valid_symbols[3] & 1U) != 0)) {
    tmp_1._7_1_ = new_delimiter();
    tmp_1._6_1_ = 0;
    while (lexer->lookahead != 0) {
      if ((lexer->lookahead == 0x66) || (lexer->lookahead == 0x46)) {
        set_format((Delimiter *)((long)&tmp_1 + 7));
      }
      else if ((lexer->lookahead == 0x72) || (lexer->lookahead == 0x52)) {
        set_raw((Delimiter *)((long)&tmp_1 + 7));
      }
      else if ((lexer->lookahead == 0x62) || (lexer->lookahead == 0x42)) {
        set_bytes((Delimiter *)((long)&tmp_1 + 7));
      }
      else if ((lexer->lookahead != 0x75) && (lexer->lookahead != 0x55)) break;
      tmp_1._6_1_ = 1;
      advance(lexer);
    }
    if (lexer->lookahead == 0x60) {
      set_end_character((Delimiter *)((long)&tmp_1 + 7),0x60);
      advance(lexer);
      (*lexer->mark_end)(lexer);
    }
    else if (lexer->lookahead == 0x27) {
      set_end_character((Delimiter *)((long)&tmp_1 + 7),0x27);
      advance(lexer);
      (*lexer->mark_end)(lexer);
      if ((lexer->lookahead == 0x27) && (advance(lexer), lexer->lookahead == 0x27)) {
        advance(lexer);
        (*lexer->mark_end)(lexer);
        set_triple((Delimiter *)((long)&tmp_1 + 7));
      }
    }
    else if (lexer->lookahead == 0x22) {
      set_end_character((Delimiter *)((long)&tmp_1 + 7),0x22);
      advance(lexer);
      (*lexer->mark_end)(lexer);
      if ((lexer->lookahead == 0x22) && (advance(lexer), lexer->lookahead == 0x22)) {
        advance(lexer);
        (*lexer->mark_end)(lexer);
        set_triple((Delimiter *)((long)&tmp_1 + 7));
      }
    }
    iVar8 = end_character((Delimiter *)((long)&tmp_1 + 7));
    if (iVar8 != 0) {
      if (*(int *)(_end_char[1] + 4) == *(int *)_end_char[1]) {
        if ((uint)(*(int *)_end_char[1] * 2) < 0x10) {
          local_8c = 0x10;
        }
        else {
          local_8c = *(int *)_end_char[1] << 1;
        }
        pvVar10 = realloc(*(void **)(_end_char[1] + 8),(ulong)local_8c);
        if (pvVar10 == (void *)0x0) {
          __assert_fail("tmp != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/PrestonKnopp[P]tree-sitter-gdscript/src/scanner.c"
                        ,0x1a5,
                        "_Bool tree_sitter_gdscript_external_scanner_scan(void *, TSLexer *, const _Bool *)"
                       );
        }
        *(void **)(_end_char[1] + 8) = pvVar10;
        if ((uint)(*(int *)_end_char[1] * 2) < 0x10) {
          local_90 = 0x10;
        }
        else {
          local_90 = *(int *)_end_char[1] << 1;
        }
        *(int *)(_end_char[1] + 4) = local_90;
      }
      lVar4 = *(long *)(_end_char[1] + 8);
      uVar3 = *(uint *)_end_char[1];
      *(uint *)_end_char[1] = uVar3 + 1;
      *(char *)(lVar4 + (ulong)uVar3) = tmp_1._7_1_;
      lexer->result_symbol = 3;
      return true;
    }
    if ((tmp_1._6_1_ & 1) != 0) {
      return false;
    }
  }
  return false;
}

Assistant:

bool tree_sitter_gdscript_external_scanner_scan(void *payload, TSLexer *lexer,
                                                const bool *valid_symbols) {
    Scanner *scanner = (Scanner *)payload;

    bool error_recovery_mode =
        valid_symbols[STRING_CONTENT] && valid_symbols[INDENT];
    bool within_brackets = valid_symbols[CLOSE_BRACE] ||
                           valid_symbols[CLOSE_PAREN] ||
                           valid_symbols[CLOSE_BRACKET];

    if (valid_symbols[STRING_CONTENT] && scanner->delimiters->len > 0 &&
        !error_recovery_mode) {
        Delimiter delimiter = VEC_BACK(scanner->delimiters);
        int32_t end_char = end_character(&delimiter);
        bool has_content = false;
        while (lexer->lookahead) {
            if ((lexer->lookahead == '{' || lexer->lookahead == '}') &&
                is_format(&delimiter)) {
                lexer->mark_end(lexer);
                lexer->result_symbol = STRING_CONTENT;
                return has_content;
            }
            if (lexer->lookahead == '\\') {
                if (is_raw(&delimiter)) {
                    // Step over the backslash.
                    lexer->advance(lexer, false);
                    // Step over any escaped quotes.
                    if (lexer->lookahead == end_character(&delimiter) ||
                        lexer->lookahead == '\\') {
                        lexer->advance(lexer, false);
                    }
                    continue;
                }
                if (is_bytes(&delimiter)) {
                    lexer->mark_end(lexer);
                    lexer->advance(lexer, false);
                    if (lexer->lookahead == 'N' || lexer->lookahead == 'u' ||
                        lexer->lookahead == 'U') {
                        // In bytes string, \N{...}, \uXXXX and \UXXXXXXXX are
                        // not escape sequences
                        // https://docs.python.org/3/reference/lexical_analysis.html#string-and-bytes-literals
                        lexer->advance(lexer, false);
                    } else {
                        lexer->result_symbol = STRING_CONTENT;
                        return has_content;
                    }
                } else {
                    lexer->mark_end(lexer);
                    lexer->result_symbol = STRING_CONTENT;
                    return has_content;
                }
            } else if (lexer->lookahead == end_char) {
                if (is_triple(&delimiter)) {
                    lexer->mark_end(lexer);
                    lexer->advance(lexer, false);
                    if (lexer->lookahead == end_char) {
                        lexer->advance(lexer, false);
                        if (lexer->lookahead == end_char) {
                            if (has_content) {
                                lexer->result_symbol = STRING_CONTENT;
                            } else {
                                lexer->advance(lexer, false);
                                lexer->mark_end(lexer);
                                VEC_POP(scanner->delimiters);
                                lexer->result_symbol = STRING_END;
                            }
                            return true;
                        }
                        lexer->mark_end(lexer);
                        lexer->result_symbol = STRING_CONTENT;
                        return true;
                    }
                    lexer->mark_end(lexer);
                    lexer->result_symbol = STRING_CONTENT;
                    return true;
                }
                if (has_content) {
                    lexer->result_symbol = STRING_CONTENT;
                } else {
                    lexer->advance(lexer, false);
                    VEC_POP(scanner->delimiters);
                    lexer->result_symbol = STRING_END;
                }
                lexer->mark_end(lexer);
                return true;

            } else if (lexer->lookahead == '\n' && has_content &&
                       !is_triple(&delimiter)) {
                return false;
            }
            advance(lexer);
            has_content = true;
        }
    }

    lexer->mark_end(lexer);

    bool found_end_of_line = false;
    uint32_t indent_length = 0;
    int32_t first_comment_indent_length = -1;
    for (;;) {
        if (lexer->lookahead == '\n') {
            found_end_of_line = true;
            indent_length = 0;
            skip(lexer);
        } else if (lexer->lookahead == ' ') {
            indent_length++;
            skip(lexer);
        } else if (lexer->lookahead == '\r' || lexer->lookahead == '\f') {
            indent_length = 0;
            skip(lexer);
        } else if (lexer->lookahead == '\t') {
            indent_length += 8;
            skip(lexer);
        } else if (lexer->lookahead == '#') {
            if (first_comment_indent_length == -1) {
                first_comment_indent_length = (int32_t)indent_length;
            }
            while (lexer->lookahead && lexer->lookahead != '\n') {
                skip(lexer);
            }
            skip(lexer);
            indent_length = 0;
        } else if (lexer->lookahead == '\\') {
            skip(lexer);
            if (lexer->lookahead == '\r') {
                skip(lexer);
            }
            if (lexer->lookahead == '\n' || lexer->eof(lexer)) {
                skip(lexer);
            } else {
                return false;
            }
        } else if (lexer->eof(lexer)) {
            indent_length = 0;
            found_end_of_line = true;
            break;
        } else {
            break;
        }
    }

    if (found_end_of_line) {
        if (scanner->indents->len > 0) {
            uint16_t current_indent_length = VEC_BACK(scanner->indents);

            if (valid_symbols[INDENT] &&
                indent_length > current_indent_length) {
                VEC_PUSH(scanner->indents, indent_length);
                lexer->result_symbol = INDENT;
                return true;
            }

            if ((valid_symbols[DEDENT] ||
                 (!valid_symbols[NEWLINE] && !valid_symbols[STRING_START] &&
                  !within_brackets)) &&
                indent_length < current_indent_length &&

                // Wait to create a dedent token until we've consumed any
                // comments
                // whose indentation matches the current block.
                first_comment_indent_length < (int32_t)current_indent_length) {
                VEC_POP(scanner->indents);
                lexer->result_symbol = DEDENT;
                return true;
            }
        }

        if (valid_symbols[NEWLINE] && !error_recovery_mode) {
            lexer->result_symbol = NEWLINE;
            return true;
        }
    }

    // This if statement can be placed before the above if statement that
    // handles newlines. However, it feels safer to give indentation and
    // newlines higher precedence.
    if (
        // Guard against BODY_END tokens overriding valid tokens.
        !valid_symbols[COMMA] &&
        /* !valid_symbols[COLON] && */
        !valid_symbols[CLOSE_PAREN] && !valid_symbols[CLOSE_BRACE] &&
        !valid_symbols[CLOSE_BRACKET] &&

        // Body ends occur in error recovery mode since the grammar does not
        // (cannot?) specify that a body can end with the below characters
        // without consuming them itself.
        (error_recovery_mode || valid_symbols[BODY_END])) {
        if (lexer->lookahead == ',' || // separator
            lexer->lookahead == ')' || // args, params, paren expr
            lexer->lookahead == '}' || // dictionary (may not be needed)
            lexer->lookahead == ']'    // array
            /* lexer->lookahead == ':'     // key-value pairs (breaks if
               elses) */
        ) {
            // BODY_END tokens can take the place of a dedent. Therefore, we
            // should pop the stack when DEDENT is valid.
            if (valid_symbols[DEDENT] && scanner->indents->len > 0) {
                VEC_POP(scanner->indents);
            }
            lexer->result_symbol = BODY_END;
            return true;
        }
    }

    if (first_comment_indent_length == -1 && valid_symbols[STRING_START]) {
        Delimiter delimiter = new_delimiter();

        bool has_flags = false;
        while (lexer->lookahead) {
            if (lexer->lookahead == 'f' || lexer->lookahead == 'F') {
                set_format(&delimiter);
            } else if (lexer->lookahead == 'r' || lexer->lookahead == 'R') {
                set_raw(&delimiter);
            } else if (lexer->lookahead == 'b' || lexer->lookahead == 'B') {
                set_bytes(&delimiter);
            } else if (lexer->lookahead != 'u' && lexer->lookahead != 'U') {
                break;
            }
            has_flags = true;
            advance(lexer);
        }

        if (lexer->lookahead == '`') {
            set_end_character(&delimiter, '`');
            advance(lexer);
            lexer->mark_end(lexer);
        } else if (lexer->lookahead == '\'') {
            set_end_character(&delimiter, '\'');
            advance(lexer);
            lexer->mark_end(lexer);
            if (lexer->lookahead == '\'') {
                advance(lexer);
                if (lexer->lookahead == '\'') {
                    advance(lexer);
                    lexer->mark_end(lexer);
                    set_triple(&delimiter);
                }
            }
        } else if (lexer->lookahead == '"') {
            set_end_character(&delimiter, '"');
            advance(lexer);
            lexer->mark_end(lexer);
            if (lexer->lookahead == '"') {
                advance(lexer);
                if (lexer->lookahead == '"') {
                    advance(lexer);
                    lexer->mark_end(lexer);
                    set_triple(&delimiter);
                }
            }
        }

        if (end_character(&delimiter)) {
            VEC_PUSH(scanner->delimiters, delimiter);
            lexer->result_symbol = STRING_START;

            return true;
        }
        if (has_flags) {
            return false;
        }
    }

    return false;
}